

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_decompress(uint8_t *compressed,uint8_t *public_key)

{
  uint64_t local_58;
  EccPoint point;
  uint8_t *public_key_local;
  uint8_t *compressed_local;
  
  point.y[3] = (uECC_word_t)public_key;
  vli_bytesToNative(&local_58,compressed + 1);
  curve_x_side(point.x + 3,&local_58);
  mod_sqrt(point.x + 3);
  if ((point.x[3] & 1) != (long)(int)(*compressed & 1)) {
    vli_sub(point.x + 3,curve_p,point.x + 3);
  }
  vli_nativeToBytes((uint8_t *)point.y[3],&local_58);
  vli_nativeToBytes((uint8_t *)(point.y[3] + 0x20),point.x + 3);
  return;
}

Assistant:

void uECC_decompress(const uint8_t compressed[uECC_BYTES+1], uint8_t public_key[uECC_BYTES*2]) {
    EccPoint point;
    vli_bytesToNative(point.x, compressed + 1);
    curve_x_side(point.y, point.x);
    mod_sqrt(point.y);

    if ((point.y[0] & 0x01) != (compressed[0] & 0x01)) {
        vli_sub(point.y, curve_p, point.y);
    }

    vli_nativeToBytes(public_key, point.x);
    vli_nativeToBytes(public_key + uECC_BYTES, point.y);
}